

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O2

void __thiscall FIX::DataDictionary::addField(DataDictionary *this,int field)

{
  int local_14;
  
  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
  _M_insert_unique<int_const&>
            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
             (this + 0xf8),&local_14);
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)(this + 0x128),&local_14);
  return;
}

Assistant:

void addField(int field) {
    m_fields.insert(field);
    m_orderedFields.push_back(field);
  }